

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::FileEntry::~FileEntry(FileEntry *this)

{
  FileEntry *this_local;
  
  ~FileEntry(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

virtual ~FileEntry() { }